

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall aim_t::SetResult(aim_t *this,AimTarget *res,double frac,AActor *th,DAngle *pitch)

{
  TVector3<double> local_40;
  double local_28;
  
  if (frac < res->frac) {
    (res->super_FTranslatedLineTarget).linetarget = th;
    (res->pitch).Degrees = pitch->Degrees;
    local_28 = (th->__Pos).Z - (this->startpos).Z;
    local_40.Y = (th->__Pos).X - (this->startpos).X;
    local_40.Z = (th->__Pos).Y - (this->startpos).Y;
    TVector3<double>::Angle(&local_40);
    (res->super_FTranslatedLineTarget).angleFromSource.Degrees = local_40.X;
    (res->super_FTranslatedLineTarget).unlinked = this->unlinked;
    res->frac = frac;
  }
  return;
}

Assistant:

void SetResult(AimTarget &res, double frac, AActor *th, DAngle pitch)
	{
		if (res.frac > frac)
		{
			res.linetarget = th;
			res.pitch = pitch;
			res.angleFromSource = (th->Pos() - startpos).Angle();
			res.unlinked = unlinked;
			res.frac = frac;
		}
	}